

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mtmsrd(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  uintptr_t o;
  uintptr_t o_1;
  
  if (ctx->pr != true) {
    tcg_ctx = ctx->uc->tcg_ctx;
    if ((((ctx->base).tb)->cflags & 0x20000) != 0) {
      gen_io_start(tcg_ctx);
    }
    if ((ctx->opcode & 0x10000) == 0) {
      gen_update_nip(ctx,(ctx->base).pc_next);
      gen_helper_store_msr
                (tcg_ctx,tcg_ctx->cpu_env,
                 *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)));
    }
    else {
      ret = tcg_temp_new_i64(tcg_ctx);
      ret_00 = tcg_temp_new_i64(tcg_ctx);
      tcg_gen_andi_i64_ppc64
                (tcg_ctx,ret,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),
                 0x8002);
      tcg_gen_andi_i64_ppc64(tcg_ctx,ret_00,cpu_msr,-0x8003);
      tcg_gen_or_i64_ppc64(tcg_ctx,ret_00,ret_00,ret);
      gen_helper_store_msr(tcg_ctx,tcg_ctx->cpu_env,ret_00);
      tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
      tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
    }
    gen_stop_exception(ctx);
    return;
  }
  gen_priv_exception(ctx,1);
  return;
}

Assistant:

static void gen_mtmsrd(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    CHK_SV;

    if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
        gen_io_start(tcg_ctx);
    }
    if (ctx->opcode & 0x00010000) {
        /* L=1 form only updates EE and RI */
        TCGv t0 = tcg_temp_new(tcg_ctx);
        TCGv t1 = tcg_temp_new(tcg_ctx);
        tcg_gen_andi_tl(tcg_ctx, t0, cpu_gpr[rS(ctx->opcode)],
                        (1 << MSR_RI) | (1 << MSR_EE));
        tcg_gen_andi_tl(tcg_ctx, t1, cpu_msr,
                        ~(target_ulong)((1 << MSR_RI) | (1 << MSR_EE)));
        tcg_gen_or_tl(tcg_ctx, t1, t1, t0);

        gen_helper_store_msr(tcg_ctx, tcg_ctx->cpu_env, t1);
        tcg_temp_free(tcg_ctx, t0);
        tcg_temp_free(tcg_ctx, t1);

    } else {
        /*
         * XXX: we need to update nip before the store if we enter
         *      power saving mode, we will exit the loop directly from
         *      ppc_store_msr
         */
        gen_update_nip(ctx, ctx->base.pc_next);
        gen_helper_store_msr(tcg_ctx, tcg_ctx->cpu_env, cpu_gpr[rS(ctx->opcode)]);
    }
    /* Must stop the translation as machine state (may have) changed */
    gen_stop_exception(ctx);
}